

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O3

int archive_compressor_xz_close(archive_write_filter *f)

{
  private_data_conflict6 *data;
  int iVar1;
  int iVar2;
  uchar *p;
  size_t length;
  
  data = (private_data_conflict6 *)f->data;
  iVar1 = drive_compressor(f,data,1);
  if (iVar1 == 0) {
    length = data->compressed_buffer_size - (data->stream).avail_out;
    data->total_out = data->total_out + length;
    iVar1 = __archive_write_filter(f->next_filter,data->compressed,length);
    if ((f->code == 9) && (iVar1 == 0)) {
      *(uint32_t *)data->compressed = data->crc32;
      *(int64_t *)(data->compressed + 4) = data->total_in;
      *(int64_t *)(data->compressed + 0xc) = data->total_out + 0x14;
      iVar1 = __archive_write_filter(f->next_filter,data->compressed,0x14);
    }
  }
  lzma_end(&data->stream);
  iVar2 = __archive_write_close_filter(f->next_filter);
  if (iVar1 <= iVar2) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

static int
archive_compressor_xz_close(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret, r1;

	ret = drive_compressor(f, data, 1);
	if (ret == ARCHIVE_OK) {
		data->total_out +=
		    data->compressed_buffer_size - data->stream.avail_out;
		ret = __archive_write_filter(f->next_filter,
		    data->compressed,
		    data->compressed_buffer_size - data->stream.avail_out);
		if (f->code == ARCHIVE_FILTER_LZIP && ret == ARCHIVE_OK) {
			archive_le32enc(data->compressed, data->crc32);
			archive_le64enc(data->compressed+4, data->total_in);
			archive_le64enc(data->compressed+12, data->total_out + 20);
			ret = __archive_write_filter(f->next_filter,
			    data->compressed, 20);
		}
	}
	lzma_end(&(data->stream));
	r1 = __archive_write_close_filter(f->next_filter);
	return (r1 < ret ? r1 : ret);
}